

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O2

void __thiscall QLinuxFbDevice::swapBuffers(QLinuxFbDevice *this,Output *output)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = output->backFb;
  iVar1 = QKmsDevice::fd(&this->super_QKmsDevice);
  iVar2 = drmModePageFlip(iVar1,(output->kmsOutput).crtc_id,output->fb[iVar2].fb,1,output);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      qErrnoWarning(*piVar3,"Page flip failed");
      return;
    }
  }
  else {
    iVar2 = output->backFb;
    iVar1 = iVar2;
    while (iVar1 == iVar2) {
      local_38 = 0;
      uStack_50 = 0;
      uStack_40 = 0;
      local_58 = 2;
      local_48 = pageFlipHandler;
      iVar1 = QKmsDevice::fd(&this->super_QKmsDevice);
      drmHandleEvent(iVar1,&local_58);
      iVar1 = output->backFb;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QLinuxFbDevice::swapBuffers(Output *output)
{
    Framebuffer &fb(output->fb[output->backFb]);
    if (drmModePageFlip(fd(), output->kmsOutput.crtc_id, fb.fb, DRM_MODE_PAGE_FLIP_EVENT, output) == -1) {
        qErrnoWarning(errno, "Page flip failed");
        return;
    }

    const int fbIdx = output->backFb;
    while (output->backFb == fbIdx) {
        drmEventContext drmEvent;
        memset(&drmEvent, 0, sizeof(drmEvent));
        drmEvent.version = 2;
        drmEvent.vblank_handler = nullptr;
        drmEvent.page_flip_handler = pageFlipHandler;
        // Blocks until there is something to read on the drm fd
        // and calls back pageFlipHandler once the flip completes.
        drmHandleEvent(fd(), &drmEvent);
    }
}